

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.h
# Opt level: O3

void __thiscall asl::HttpMessage::put(HttpMessage *this,char *body)

{
  int *piVar1;
  size_t sVar2;
  ulong uVar3;
  uint m;
  Array<unsigned_char> local_20;
  
  sVar2 = strlen(body);
  m = (uint)sVar2;
  Array<unsigned_char>::alloc(&local_20,m);
  if (0 < (int)m) {
    uVar3 = 0;
    do {
      local_20._a[uVar3] = body[uVar3];
      uVar3 = uVar3 + 1;
    } while ((m & 0x7fffffff) != uVar3);
  }
  put(this,&local_20);
  LOCK();
  piVar1 = (int *)(local_20._a + -8);
  *piVar1 = *piVar1 + -1;
  UNLOCK();
  if (*piVar1 == 0) {
    free(local_20._a + -0x10);
  }
  return;
}

Assistant:

void put(const char* body) { put(ByteArray((const byte*)body, (int)strlen(body))); }